

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void Store16x4_SSE2(__m128i *p1,__m128i *p0,__m128i *q0,__m128i *q1,uint8_t *r0,uint8_t *r8,
                   int stride)

{
  __m128i alVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [12];
  unkbyte10 Var4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [12];
  unkbyte10 Var7;
  undefined2 uVar8;
  undefined2 uVar15;
  undefined1 auVar22 [16];
  undefined1 auVar30 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined2 local_78;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  undefined2 local_68;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  undefined2 uStack_60;
  undefined2 uStack_5e;
  undefined2 uStack_5c;
  undefined2 uStack_5a;
  __m128i local_58;
  __m128i local_48;
  undefined4 uVar9;
  undefined6 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [14];
  undefined1 auVar14 [16];
  undefined4 uVar16;
  undefined6 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [14];
  undefined1 auVar21 [16];
  undefined1 auVar31 [16];
  undefined1 auVar23 [16];
  undefined1 auVar32 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar33 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar34 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  
  alVar1 = *p1;
  auVar29._0_14_ = alVar1._0_14_;
  auVar29[0xe] = alVar1[0]._7_1_;
  auVar29[0xf] = *(undefined1 *)((long)*p0 + 7);
  auVar28._14_2_ = auVar29._14_2_;
  auVar28._0_13_ = alVar1._0_13_;
  auVar28[0xd] = *(undefined1 *)((long)*p0 + 6);
  auVar27._13_3_ = auVar28._13_3_;
  auVar27._0_12_ = alVar1._0_12_;
  auVar27[0xc] = alVar1[0]._6_1_;
  auVar26._12_4_ = auVar27._12_4_;
  auVar26._0_11_ = alVar1._0_11_;
  auVar26[0xb] = *(undefined1 *)((long)*p0 + 5);
  auVar25._11_5_ = auVar26._11_5_;
  auVar25._0_10_ = alVar1._0_10_;
  auVar25[10] = alVar1[0]._5_1_;
  auVar24._10_6_ = auVar25._10_6_;
  auVar24._0_9_ = alVar1._0_9_;
  auVar24[9] = *(undefined1 *)((long)*p0 + 4);
  auVar23._9_7_ = auVar24._9_7_;
  auVar23._0_8_ = alVar1[0];
  auVar23[8] = alVar1[0]._4_1_;
  Var4 = CONCAT91(CONCAT81(auVar23._8_8_,*(undefined1 *)((long)*p0 + 3)),alVar1[0]._3_1_);
  auVar3._2_10_ = Var4;
  auVar3[1] = *(undefined1 *)((long)*p0 + 2);
  auVar3[0] = alVar1[0]._2_1_;
  auVar2._2_12_ = auVar3;
  auVar2[1] = *(undefined1 *)((long)*p0 + 1);
  auVar2[0] = alVar1[0]._1_1_;
  auVar22._0_2_ = CONCAT11((char)(*p0)[0],(char)alVar1[0]);
  auVar22._2_14_ = auVar2;
  uVar15 = CONCAT11((char)(*p0)[1],(char)alVar1[1]);
  uVar16 = CONCAT13(*(undefined1 *)((long)*p0 + 9),CONCAT12(alVar1[1]._1_1_,uVar15));
  uVar17 = CONCAT15(*(undefined1 *)((long)*p0 + 10),CONCAT14(alVar1[1]._2_1_,uVar16));
  uVar18 = CONCAT17(*(undefined1 *)((long)*p0 + 0xb),CONCAT16(alVar1[1]._3_1_,uVar17));
  auVar19._0_10_ = CONCAT19(*(undefined1 *)((long)*p0 + 0xc),CONCAT18(alVar1[1]._4_1_,uVar18));
  auVar19[10] = alVar1[1]._5_1_;
  auVar19[0xb] = *(undefined1 *)((long)*p0 + 0xd);
  auVar20[0xc] = alVar1[1]._6_1_;
  auVar20._0_12_ = auVar19;
  auVar20[0xd] = *(undefined1 *)((long)*p0 + 0xe);
  auVar21[0xe] = alVar1[1]._7_1_;
  auVar21._0_14_ = auVar20;
  auVar21[0xf] = *(undefined1 *)((long)*p0 + 0xf);
  alVar1 = *q0;
  auVar44._0_14_ = alVar1._0_14_;
  auVar44[0xe] = alVar1[0]._7_1_;
  auVar44[0xf] = *(undefined1 *)((long)*q1 + 7);
  auVar43._14_2_ = auVar44._14_2_;
  auVar43._0_13_ = alVar1._0_13_;
  auVar43[0xd] = *(undefined1 *)((long)*q1 + 6);
  auVar42._13_3_ = auVar43._13_3_;
  auVar42._0_12_ = alVar1._0_12_;
  auVar42[0xc] = alVar1[0]._6_1_;
  auVar41._12_4_ = auVar42._12_4_;
  auVar41._0_11_ = alVar1._0_11_;
  auVar41[0xb] = *(undefined1 *)((long)*q1 + 5);
  auVar40._11_5_ = auVar41._11_5_;
  auVar40._0_10_ = alVar1._0_10_;
  auVar40[10] = alVar1[0]._5_1_;
  auVar39._10_6_ = auVar40._10_6_;
  auVar39._0_9_ = alVar1._0_9_;
  auVar39[9] = *(undefined1 *)((long)*q1 + 4);
  auVar38._9_7_ = auVar39._9_7_;
  auVar38._0_8_ = alVar1[0];
  auVar38[8] = alVar1[0]._4_1_;
  Var7 = CONCAT91(CONCAT81(auVar38._8_8_,*(undefined1 *)((long)*q1 + 3)),alVar1[0]._3_1_);
  auVar6._2_10_ = Var7;
  auVar6[1] = *(undefined1 *)((long)*q1 + 2);
  auVar6[0] = alVar1[0]._2_1_;
  auVar5._2_12_ = auVar6;
  auVar5[1] = *(undefined1 *)((long)*q1 + 1);
  auVar5[0] = alVar1[0]._1_1_;
  local_58[0]._3_1_ = (char)(*q1)[0];
  local_58[0]._2_1_ = (char)alVar1[0];
  uVar8 = CONCAT11((char)(*q1)[1],(char)alVar1[1]);
  uVar9 = CONCAT13(*(undefined1 *)((long)*q1 + 9),CONCAT12(alVar1[1]._1_1_,uVar8));
  uVar10 = CONCAT15(*(undefined1 *)((long)*q1 + 10),CONCAT14(alVar1[1]._2_1_,uVar9));
  uVar11 = CONCAT17(*(undefined1 *)((long)*q1 + 0xb),CONCAT16(alVar1[1]._3_1_,uVar10));
  auVar12._0_10_ = CONCAT19(*(undefined1 *)((long)*q1 + 0xc),CONCAT18(alVar1[1]._4_1_,uVar11));
  auVar12[10] = alVar1[1]._5_1_;
  auVar12[0xb] = *(undefined1 *)((long)*q1 + 0xd);
  auVar13[0xc] = alVar1[1]._6_1_;
  auVar13._0_12_ = auVar12;
  auVar13[0xd] = *(undefined1 *)((long)*q1 + 0xe);
  auVar14[0xe] = alVar1[1]._7_1_;
  auVar14._0_14_ = auVar13;
  auVar14[0xf] = *(undefined1 *)((long)*q1 + 0xf);
  auVar37._0_12_ = auVar22._0_12_;
  auVar37._12_2_ = (short)Var4;
  auVar37._14_2_ = (short)Var7;
  auVar36._12_4_ = auVar37._12_4_;
  auVar36._0_10_ = auVar22._0_10_;
  auVar36._10_2_ = auVar6._0_2_;
  auVar35._10_6_ = auVar36._10_6_;
  auVar35._0_8_ = auVar22._0_8_;
  auVar35._8_2_ = auVar3._0_2_;
  local_58[1] = auVar35._8_8_;
  local_58[0]._6_2_ = auVar5._0_2_;
  local_58[0]._4_2_ = auVar2._0_2_;
  local_58[0]._0_2_ = auVar22._0_2_;
  local_68 = auVar23._8_2_;
  uStack_66 = auVar38._8_2_;
  uStack_64 = auVar25._10_2_;
  uStack_62 = auVar40._10_2_;
  uStack_60 = auVar27._12_2_;
  uStack_5e = auVar42._12_2_;
  auVar34._12_2_ = (short)((ulong)uVar18 >> 0x30);
  auVar34._0_12_ = auVar19;
  auVar34._14_2_ = (short)((ulong)uVar11 >> 0x30);
  auVar33._12_4_ = auVar34._12_4_;
  auVar33._10_2_ = (short)((uint6)uVar10 >> 0x20);
  auVar33._0_10_ = auVar19._0_10_;
  auVar32._10_6_ = auVar33._10_6_;
  auVar32._8_2_ = (short)((uint6)uVar17 >> 0x20);
  auVar32._0_8_ = uVar18;
  auVar31._8_8_ = auVar32._8_8_;
  auVar31._6_2_ = (short)((uint)uVar9 >> 0x10);
  auVar31._0_6_ = uVar17;
  auVar30._6_10_ = auVar31._6_10_;
  auVar30._4_2_ = (short)((uint)uVar16 >> 0x10);
  auVar30._0_4_ = uVar16;
  local_48._4_12_ = auVar30._4_12_;
  local_48[0]._2_2_ = uVar8;
  local_48[0]._0_2_ = uVar15;
  local_78 = (undefined2)((unkuint10)auVar19._0_10_ >> 0x40);
  uStack_76 = (undefined2)((unkuint10)auVar12._0_10_ >> 0x40);
  uStack_74 = auVar19._10_2_;
  uStack_72 = auVar12._10_2_;
  uStack_70 = auVar20._12_2_;
  uStack_6e = auVar13._12_2_;
  uStack_6c = auVar21._14_2_;
  uStack_6a = auVar14._14_2_;
  uStack_5c = auVar28._14_2_;
  uStack_5a = auVar43._14_2_;
  Store4x4_SSE2(&local_58,r0,stride);
  Store4x4_SSE2((__m128i *)&local_68,r0 + stride * 4,stride);
  Store4x4_SSE2(&local_48,r8,stride);
  Store4x4_SSE2((__m128i *)&local_78,r8 + stride * 4,stride);
  return;
}

Assistant:

static WEBP_INLINE void Store16x4_SSE2(const __m128i* const p1,
                                       const __m128i* const p0,
                                       const __m128i* const q0,
                                       const __m128i* const q1,
                                       uint8_t* r0, uint8_t* r8,
                                       int stride) {
  __m128i t1, p1_s, p0_s, q0_s, q1_s;

  // p0 = 71 70 61 60 51 50 41 40 31 30 21 20 11 10 01 00
  // p1 = f1 f0 e1 e0 d1 d0 c1 c0 b1 b0 a1 a0 91 90 81 80
  t1 = *p0;
  p0_s = _mm_unpacklo_epi8(*p1, t1);
  p1_s = _mm_unpackhi_epi8(*p1, t1);

  // q0 = 73 72 63 62 53 52 43 42 33 32 23 22 13 12 03 02
  // q1 = f3 f2 e3 e2 d3 d2 c3 c2 b3 b2 a3 a2 93 92 83 82
  t1 = *q0;
  q0_s = _mm_unpacklo_epi8(t1, *q1);
  q1_s = _mm_unpackhi_epi8(t1, *q1);

  // p0 = 33 32 31 30 23 22 21 20 13 12 11 10 03 02 01 00
  // q0 = 73 72 71 70 63 62 61 60 53 52 51 50 43 42 41 40
  t1 = p0_s;
  p0_s = _mm_unpacklo_epi16(t1, q0_s);
  q0_s = _mm_unpackhi_epi16(t1, q0_s);

  // p1 = b3 b2 b1 b0 a3 a2 a1 a0 93 92 91 90 83 82 81 80
  // q1 = f3 f2 f1 f0 e3 e2 e1 e0 d3 d2 d1 d0 c3 c2 c1 c0
  t1 = p1_s;
  p1_s = _mm_unpacklo_epi16(t1, q1_s);
  q1_s = _mm_unpackhi_epi16(t1, q1_s);

  Store4x4_SSE2(&p0_s, r0, stride);
  r0 += 4 * stride;
  Store4x4_SSE2(&q0_s, r0, stride);

  Store4x4_SSE2(&p1_s, r8, stride);
  r8 += 4 * stride;
  Store4x4_SSE2(&q1_s, r8, stride);
}